

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O3

void __thiscall pfederc::LogMessage::LogMessage(LogMessage *this,LogMessage *msg)

{
  pointer pcVar1;
  
  this->_vptr_LogMessage = (_func_int **)&PTR__LogMessage_00127548;
  this->logLevel = msg->logLevel;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  pcVar1 = (msg->msg)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar1,pcVar1 + (msg->msg)._M_string_length);
  std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
            (&this->msgs,&msg->msgs);
  return;
}

Assistant:

LogMessage::LogMessage(const LogMessage &msg) noexcept
    : logLevel{msg.logLevel}, msg(msg.msg), msgs(msg.msgs) {
}